

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

void Gia_ManReprFromAigRepr(Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Rpr_t *pGVar5;
  Aig_Obj_t *pAVar6;
  int *piVar7;
  bool bVar8;
  int local_34;
  int i;
  Aig_Obj_t *pReprAig;
  Aig_Obj_t *pObjAig;
  Gia_Obj_t *pObjGia;
  Gia_Man_t *pGia_local;
  Aig_Man_t *pAig_local;
  
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                  ,0x1ed,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->pReprs == (Gia_Rpr_t *)0x0) {
    iVar1 = Gia_ManObjNum(pGia);
    iVar2 = Gia_ManCoNum(pGia);
    iVar3 = Aig_ManObjNum(pAig);
    iVar4 = Aig_ManCoNum(pAig);
    if (iVar1 - iVar2 != iVar3 - iVar4) {
      __assert_fail("Gia_ManObjNum(pGia) - Gia_ManCoNum(pGia) == Aig_ManObjNum(pAig) - Aig_ManCoNum(pAig)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                    ,0x1ef,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
    }
    iVar1 = Gia_ManObjNum(pGia);
    pGVar5 = (Gia_Rpr_t *)calloc((long)iVar1,4);
    pGia->pReprs = pGVar5;
    for (local_34 = 0; iVar1 = Gia_ManObjNum(pGia), local_34 < iVar1; local_34 = local_34 + 1) {
      Gia_ObjSetRepr(pGia,local_34,0xfffffff);
    }
    local_34 = 0;
    while( true ) {
      bVar8 = false;
      if (local_34 < pGia->nObjs) {
        pObjAig = (Aig_Obj_t *)Gia_ManObj(pGia,local_34);
        bVar8 = pObjAig != (Aig_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar1 = Gia_ObjIsCo((Gia_Obj_t *)pObjAig);
      if (iVar1 == 0) {
        if (local_34 != 0) {
          iVar1 = Gia_ObjValue((Gia_Obj_t *)pObjAig);
          iVar1 = Abc_LitIsCompl(iVar1);
          if (iVar1 != 0) {
            __assert_fail("i == 0 || !Abc_LitIsCompl(Gia_ObjValue(pObjGia))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                          ,0x1f8,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
          }
        }
        iVar1 = Gia_ObjValue((Gia_Obj_t *)pObjAig);
        iVar1 = Abc_Lit2Var(iVar1);
        pAVar6 = Aig_ManObj(pAig,iVar1);
        (pAVar6->field_5).iData = local_34;
      }
      local_34 = local_34 + 1;
    }
    for (local_34 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_34 < iVar1; local_34 = local_34 + 1)
    {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_34);
      if (((pAVar6 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsCo(pAVar6), iVar1 == 0)) &&
         (pAig->pReprs[local_34] != (Aig_Obj_t *)0x0)) {
        Gia_ObjSetRepr(pGia,(pAVar6->field_5).iData,(pAig->pReprs[local_34]->field_5).iData);
      }
    }
    piVar7 = Gia_ManDeriveNexts(pGia);
    pGia->pNexts = piVar7;
    return;
  }
  __assert_fail("pGia->pReprs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                ,0x1ee,"void Gia_ManReprFromAigRepr(Aig_Man_t *, Gia_Man_t *)");
}

Assistant:

void Gia_ManReprFromAigRepr( Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObjGia; 
    Aig_Obj_t * pObjAig, * pReprAig;
    int i;
    assert( pAig->pReprs != NULL );
    assert( pGia->pReprs == NULL );
    assert( Gia_ManObjNum(pGia) - Gia_ManCoNum(pGia) == Aig_ManObjNum(pAig) - Aig_ManCoNum(pAig) );
    pGia->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pGia) );
    for ( i = 0; i < Gia_ManObjNum(pGia); i++ )
        Gia_ObjSetRepr( pGia, i, GIA_VOID );
    // move pointers from GIA to AIG
    Gia_ManForEachObj( pGia, pObjGia, i )
    {
        if ( Gia_ObjIsCo(pObjGia) )
            continue;
        assert( i == 0 || !Abc_LitIsCompl(Gia_ObjValue(pObjGia)) );
        pObjAig  = Aig_ManObj( pAig, Abc_Lit2Var(Gia_ObjValue(pObjGia)) );
        pObjAig->iData = i;
    }
    Aig_ManForEachObj( pAig, pObjAig, i )
    {
        if ( Aig_ObjIsCo(pObjAig) )
            continue;
        if ( pAig->pReprs[i] == NULL )
            continue;
        pReprAig = pAig->pReprs[i];
        Gia_ObjSetRepr( pGia, pObjAig->iData, pReprAig->iData );
    }
    pGia->pNexts = Gia_ManDeriveNexts( pGia );
}